

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O2

int rtext_findatomfor(_rtext *x,int xpos,int ypos)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int indx;
  int h;
  int w;
  
  h = ypos;
  w = xpos;
  rtext_senditup(x,2,&w,&h,&indx);
  iVar4 = 0;
  bVar2 = false;
  for (lVar5 = 0; lVar5 <= indx; lVar5 = lVar5 + 1) {
    cVar1 = x->x_buf[lVar5];
    bVar3 = false;
    if ((cVar1 != '\n') && (cVar1 != ' ')) {
      if ((cVar1 == ';') || (cVar1 == ',')) {
        iVar4 = iVar4 + 1;
      }
      else {
        iVar4 = iVar4 + (uint)!bVar2;
        bVar3 = true;
      }
    }
    bVar2 = bVar3;
  }
  return iVar4 + -1;
}

Assistant:

int rtext_findatomfor(t_rtext *x, int xpos, int ypos)
{
    int w = xpos, h = ypos, indx, natom = 0, i, gotone = 0;
        /* get byte index of character clicked on */
    rtext_senditup(x, SEND_UPDATE, &w, &h, &indx);
        /* search through for whitespace before that index */
    for (i = 0; i <= indx; i++)
    {
        if (x->x_buf[i] == ';' || x->x_buf[i] == ',')
            natom++, gotone = 0;
        else if (x->x_buf[i] == ' ' || x->x_buf[i] == '\n')
            gotone = 0;
        else
        {
            if (!gotone)
                natom++;
            gotone = 1;
        }
    }
    return (natom-1);
}